

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumScaledTexture::Evaluate
          (SpectrumScaledTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar4 [56];
  undefined8 uVar5;
  undefined1 auVar7 [56];
  SampledSpectrum SVar8;
  DispatchSplit<10> local_81;
  uintptr_t local_80;
  float local_78;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_68;
  float afStack_60 [2];
  float afStack_58 [2];
  float afStack_50 [2];
  Tuple3<pbrt::Point3,_float> local_48 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_30 [3];
  int iStack_c;
  undefined1 auVar3 [64];
  undefined1 auVar6 [64];
  
  local_48[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_48[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_48[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_48[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_48[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_48[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_30[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_30[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_30[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_30[1].z = ctx.dudx;
  aTStack_30[2].x = ctx.dudy;
  aTStack_30[2].y = ctx.dvdx;
  aTStack_30[2].z = ctx.dvdy;
  iStack_c = ctx.faceIndex;
  local_68.bits =
       (this->scale).
       super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
       .bits;
  local_78 = DispatchSplit<12>::operator()
                       ((DispatchSplit<12> *)&local_80,local_48,&local_68,local_68.bits >> 0x30);
  uVar5 = 0;
  auVar2._0_8_ = 0;
  if ((local_78 != 0.0) || (NAN(local_78))) {
    local_48[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_48[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_48[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_48[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_48[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_48[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_30[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_30[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_30[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_30[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_30[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_30[1].z = ctx.dudx;
    aTStack_30[2].x = ctx.dudy;
    aTStack_30[2].y = ctx.dvdx;
    aTStack_30[2].z = ctx.dvdy;
    iStack_c = ctx.faceIndex;
    local_68.bits._0_4_ = lambda.lambda.values[0];
    local_68.bits._4_4_ = lambda.lambda.values[1];
    afStack_60[0] = lambda.lambda.values[2];
    afStack_60[1] = lambda.lambda.values[3];
    afStack_58[0] = lambda.pdf.values[0];
    afStack_58[1] = lambda.pdf.values[1];
    afStack_50[0] = lambda.pdf.values[2];
    afStack_50[1] = lambda.pdf.values[3];
    local_80 = (this->tex).
               super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
    auVar4 = ZEXT856((ulong)lambda.lambda.values._8_8_);
    auVar7 = ZEXT856(0);
    SVar8 = DispatchSplit<10>::operator()(&local_81);
    auVar6._0_8_ = SVar8.values.values._8_8_;
    auVar6._8_56_ = auVar7;
    auVar3._0_8_ = SVar8.values.values._0_8_;
    auVar3._8_56_ = auVar4;
    auVar1 = vmovlhps_avx(auVar3._0_16_,auVar6._0_16_);
    auVar2._0_8_ = CONCAT44(local_78 * auVar1._4_4_,local_78 * auVar1._0_4_);
    auVar2._8_4_ = local_78 * auVar1._8_4_;
    auVar2._12_4_ = local_78 * auVar1._12_4_;
    auVar1 = vshufpd_avx(auVar2,auVar2,1);
    uVar5 = auVar1._0_8_;
  }
  SVar8.values.values[2] = (float)(int)uVar5;
  SVar8.values.values[3] = (float)(int)((ulong)uVar5 >> 0x20);
  SVar8.values.values[0] = (float)(int)auVar2._0_8_;
  SVar8.values.values[1] = (float)(int)((ulong)auVar2._0_8_ >> 0x20);
  return (SampledSpectrum)SVar8.values.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Float sc = scale.Evaluate(ctx);
        if (sc == 0)
            return SampledSpectrum(0.f);
        return tex.Evaluate(ctx, lambda) * sc;
    }